

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O3

int __thiscall zmq::stream_engine_base_t::write_credential(stream_engine_base_t *this,msg_t *msg_)

{
  int iVar1;
  blob_t *pbVar2;
  void *__dest;
  msg_t *this_00;
  msg_t msg;
  msg_t local_60;
  
  if (this->_mechanism == (mechanism_t *)0x0) {
    write_credential();
  }
  if (this->_session == (session_base_t *)0x0) {
    write_credential();
  }
  pbVar2 = mechanism_t::get_user_id(this->_mechanism);
  if (pbVar2->_size != 0) {
    iVar1 = msg_t::init_size(&local_60,pbVar2->_size);
    if (iVar1 != 0) {
      write_credential();
    }
    this_00 = &local_60;
    __dest = msg_t::data(this_00);
    memcpy(__dest,pbVar2->_data,pbVar2->_size);
    msg_t::set_flags(this_00,' ');
    iVar1 = (*(this->_session->super_own_t).super_object_t._vptr_object_t[0x1d])();
    if (iVar1 == -1) {
      iVar1 = msg_t::close(&local_60,(int)this_00);
      if (iVar1 != 0) {
        write_credential();
      }
      return -1;
    }
  }
  this->_process_msg = 0x69;
  *(undefined8 *)&this->field_0x560 = 0;
  iVar1 = (*(this->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0xd])(this,msg_);
  return iVar1;
}

Assistant:

int zmq::stream_engine_base_t::write_credential (msg_t *msg_)
{
    zmq_assert (_mechanism != NULL);
    zmq_assert (_session != NULL);

    const blob_t &credential = _mechanism->get_user_id ();
    if (credential.size () > 0) {
        msg_t msg;
        int rc = msg.init_size (credential.size ());
        zmq_assert (rc == 0);
        memcpy (msg.data (), credential.data (), credential.size ());
        msg.set_flags (msg_t::credential);
        rc = _session->push_msg (&msg);
        if (rc == -1) {
            rc = msg.close ();
            errno_assert (rc == 0);
            return -1;
        }
    }
    _process_msg = &stream_engine_base_t::decode_and_push;
    return decode_and_push (msg_);
}